

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *psVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  bool bVar7;
  int iVar8;
  CURLcode CVar9;
  undefined8 uVar10;
  long lVar11;
  ostream *poVar12;
  CURL *curl;
  undefined8 *puVar13;
  char *pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined1 auVar16 [8];
  string *s;
  ulong uVar17;
  string err_1;
  cURLEasyGuard g_curl;
  string actualHash_1;
  string expectedHash;
  string file;
  cURLProgressHelper helper;
  string dir;
  cmFileCommandVectorOfChar chunkDebug;
  string hashMatchMSG;
  string statusVar;
  string logVar;
  ofstream fout;
  string url;
  bool local_569;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_568;
  long local_560;
  undefined1 local_558 [8];
  char *local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548 [6];
  ios_base local_4e8 [264];
  cURLEasyGuard local_3e0;
  string local_3d8;
  char *local_3b8;
  cmFileCommand *local_3b0;
  char local_3a8;
  undefined7 uStack_3a7;
  string local_398;
  undefined1 local_378 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  string local_348;
  vector<char,_std::allocator<char>_> local_328;
  ulong local_310;
  char *local_308;
  undefined1 *local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  byte abStack_280 [80];
  ios_base local_230 [136];
  ios_base local_1a8 [264];
  long *local_a0 [2];
  long local_90 [2];
  string *local_80;
  long local_78;
  string local_70;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_2a0 = (undefined1  [8])&local_290;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a0,"DOWNLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
    if (local_2a0 != (undefined1  [8])&local_290) {
      operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
    }
    return false;
  }
  local_a0[0] = local_90;
  pcVar3 = pbVar2[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  pcVar4 = (this->super_cmCommand).Makefile;
  local_2a0 = (undefined1  [8])&local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"CMAKE_TLS_VERIFY","");
  local_569 = cmMakefile::IsOn(pcVar4,(string *)local_2a0);
  if (local_2a0 != (undefined1  [8])&local_290) {
    operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_cmCommand).Makefile;
  local_2a0 = (undefined1  [8])&local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"CMAKE_TLS_CAINFO","");
  local_308 = cmMakefile::GetDefinition(pcVar4,(string *)local_2a0);
  s = pbVar2 + 3;
  if (local_2a0 != (undefined1  [8])&local_290) {
    operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
  }
  local_3b8 = &local_3a8;
  lVar11 = 0;
  local_3b0 = (cmFileCommand *)0x0;
  local_3a8 = '\0';
  local_300 = &local_2f0;
  local_2f8 = (char *)0x0;
  local_2f0 = 0;
  if (s == (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) {
    local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_560 = 0;
    uVar17 = 0;
  }
  else {
    local_560 = 0;
    lVar11 = 0;
    local_310 = 0;
    local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    do {
      iVar8 = std::__cxx11::string::compare((char *)s);
      if (iVar8 == 0) {
        s = s + 1;
        if (s == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
          local_2a0 = (undefined1  [8])&local_290;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a0,"DOWNLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
          goto LAB_00365713;
        }
        local_560 = atol((s->_M_dataplus)._M_p);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)s);
        if (iVar8 == 0) {
          s = s + 1;
          if (s == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
            local_2a0 = (undefined1  [8])&local_290;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a0,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
            goto LAB_00365713;
          }
          lVar11 = atol((s->_M_dataplus)._M_p);
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)s);
          if (iVar8 == 0) {
            if (s + 1 == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
              local_2a0 = (undefined1  [8])&local_290;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2a0,"DOWNLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
              goto LAB_00365713;
            }
            std::__cxx11::string::_M_assign((string *)&local_2c0);
            s = s + 1;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)s);
            if (iVar8 == 0) {
              if (s + 1 == (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish) {
                local_2a0 = (undefined1  [8])&local_290;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2a0,"DOWNLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
                goto LAB_00365713;
              }
              std::__cxx11::string::_M_assign((string *)&local_2e0);
              s = s + 1;
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)s);
              if (iVar8 == 0) {
                s = s + 1;
                if (s == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
                  local_2a0 = (undefined1  [8])&local_290;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2a0,"TLS_VERIFY missing bool value.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
                  goto LAB_00365713;
                }
                local_569 = cmSystemTools::IsOn((s->_M_dataplus)._M_p);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)s);
                if (iVar8 == 0) {
                  s = s + 1;
                  if (s == (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish) {
                    local_2a0 = (undefined1  [8])&local_290;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2a0,"TLS_CAFILE missing file value.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
                    goto LAB_00365713;
                  }
                  local_308 = (s->_M_dataplus)._M_p;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)s);
                  if (iVar8 == 0) {
                    s = s + 1;
                    if (s == (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish) {
                      local_2a0 = (undefined1  [8])&local_290;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2a0,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                                 "");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
                      goto LAB_00365713;
                    }
                    cmCryptoHash::New((cmCryptoHash *)local_2a0,"MD5");
                    auVar5 = local_2a0;
                    local_2a0 = (undefined1  [8])0x0;
                    if ((undefined1  [8])local_568 != auVar5) {
                      if (local_568 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        (*((_func_int **)local_568->_M_allocated_capacity)[1])();
                      }
                      local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)auVar5;
                    }
                    if (local_2a0 != (undefined1  [8])0x0) {
                      (*(*(_func_int ***)local_2a0)[1])();
                    }
                    std::__cxx11::string::_M_replace((ulong)&local_300,0,local_2f8,0x508750);
                    cmsys::SystemTools::LowerCase((string *)local_2a0,s);
                    std::__cxx11::string::operator=((string *)&local_3b8,(string *)local_2a0);
                    if (local_2a0 != (undefined1  [8])&local_290) {
                      operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    uVar10 = std::__cxx11::string::compare((char *)s);
                    if ((int)uVar10 == 0) {
                      local_310 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)s);
                      if (iVar8 == 0) {
                        psVar1 = s + 1;
                        local_78 = lVar11;
                        if (psVar1 == (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish) {
                          local_2a0 = (undefined1  [8])&local_290;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2a0,
                                     "DOWNLOAD missing ALGO=value for EXPECTED_HASH.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
                        }
                        else {
                          lVar11 = std::__cxx11::string::find((char *)psVar1,0x519c3e,0);
                          if (lVar11 != -1) {
                            std::__cxx11::string::substr((ulong)local_2a0,(ulong)psVar1);
                            local_80 = psVar1;
                            std::__cxx11::string::substr((ulong)local_378,(ulong)psVar1);
                            cmsys::SystemTools::LowerCase((string *)local_558,(string *)local_378);
                            lVar11 = local_78;
                            std::__cxx11::string::operator=
                                      ((string *)&local_3b8,(string *)local_558);
                            if (local_558 != (undefined1  [8])local_548) {
                              operator_delete((void *)local_558,
                                              CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                                       local_548[0]._M_local_buf[0]) + 1);
                            }
                            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                              operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
                            }
                            cmCryptoHash::New((cmCryptoHash *)local_558,(char *)local_2a0);
                            auVar5 = local_558;
                            local_558 = (undefined1  [8])0x0;
                            auVar16 = (undefined1  [8])local_568;
                            if (((undefined1  [8])local_568 != auVar5) &&
                               (auVar16 = auVar5,
                               local_568 !=
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0)) {
                              (*((_func_int **)local_568->_M_allocated_capacity)[1])();
                            }
                            if (local_558 != (undefined1  [8])0x0) {
                              (*(*(_func_int ***)local_558)[1])();
                            }
                            if (auVar16 == (undefined1  [8])0x0) {
                              local_558 = (undefined1  [8])local_548;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_558,
                                         "DOWNLOAD EXPECTED_HASH given unknown ALGO: ","");
                              std::__cxx11::string::_M_append((char *)local_558,(ulong)local_2a0);
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
                            }
                            else {
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_558,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_2a0," hash");
                              std::__cxx11::string::operator=
                                        ((string *)&local_300,(string *)local_558);
                            }
                            if (local_558 != (undefined1  [8])local_548) {
                              operator_delete((void *)local_558,
                                              CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                                       local_548[0]._M_local_buf[0]) + 1);
                            }
                            if (local_2a0 != (undefined1  [8])&local_290) {
                              operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1)
                              ;
                            }
                            s = local_80;
                            local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)auVar16;
                            if (auVar16 != (undefined1  [8])0x0) goto LAB_00364f10;
                            bVar6 = false;
                            goto LAB_0036582d;
                          }
                          local_2a0 = (undefined1  [8])&local_290;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2a0,
                                     "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ","");
                          std::__cxx11::string::_M_append(local_2a0,(ulong)s[1]._M_dataplus._M_p);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
                        }
LAB_00365713:
                        if (local_2a0 != (undefined1  [8])&local_290) {
                          operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
                        }
                        bVar6 = false;
                        goto LAB_0036582d;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00364f10:
      s = s + 1;
      uVar17 = local_310;
    } while (s != (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar6 = cmsys::SystemTools::FileExists(local_398._M_dataplus._M_p);
  if (bVar6 && local_568 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) {
    local_550 = (char *)0x0;
    local_548[0]._M_local_buf[0] = '\0';
    local_558 = (undefined1  [8])local_548;
    cmCryptoHash::HashFile
              ((string *)local_378,(cmCryptoHash *)&local_568->_M_allocated_capacity,&local_398);
    if ((cmFileCommand *)local_378._8_8_ == local_3b0) {
      if ((cmFileCommand *)local_378._8_8_ == (cmFileCommand *)0x0) {
        bVar6 = true;
      }
      else {
        iVar8 = bcmp((void *)local_378._0_8_,local_3b8,local_378._8_8_);
        bVar6 = iVar8 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6 == false) {
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
      }
      if (local_558 != (undefined1  [8])local_548) {
        operator_delete((void *)local_558,
                        CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                 local_548[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)local_558,0,local_550,0x508809);
      std::__cxx11::string::_M_append(local_558,(ulong)local_300);
      std::__cxx11::string::append(local_558);
      if (local_2e0._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
        poVar12 = (ostream *)std::ostream::operator<<(local_2a0,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\"",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,(char *)local_558,(long)local_550);
        pcVar4 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(pcVar4,&local_2e0,local_348._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
        std::ios_base::~ios_base(local_230);
      }
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
      }
      if (local_558 != (undefined1  [8])local_548) {
        operator_delete((void *)local_558,
                        CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                 local_548[0]._M_local_buf[0]) + 1);
      }
      if (bVar6 != false) goto LAB_0036582d;
    }
  }
  else {
    bVar6 = false;
  }
  cmsys::SystemTools::GetFilenamePath(&local_348,&local_398);
  bVar7 = cmsys::SystemTools::FileExists(local_348._M_dataplus._M_p);
  if ((bVar7) || (bVar7 = cmsys::SystemTools::MakeDirectory(local_348._M_dataplus._M_p), bVar7)) {
    std::ofstream::ofstream(local_2a0,local_398._M_dataplus._M_p,_S_bin);
    if ((abStack_280[(long)((cmCryptoHash *)((long)local_2a0 + -0x18))->_vptr_cmCryptoHash] & 5) ==
        0) {
      curl_global_init(3);
      curl = curl_easy_init();
      if (curl == (CURL *)0x0) {
        local_558 = (undefined1  [8])local_548;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_558,"DOWNLOAD error initializing curl.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
        goto LAB_00365277;
      }
      local_3e0.Easy = curl;
      CVar9 = curl_easy_setopt(curl,CURLOPT_URL,local_a0[0]);
      if (CVar9 == CURLE_OK) {
        CVar9 = curl_easy_setopt(curl,CURLOPT_FAILONERROR,1);
        if (CVar9 != CURLE_OK) {
          local_558 = (undefined1  [8])local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,"DOWNLOAD cannot set http failure option: ","");
          curl_easy_strerror(CVar9);
          std::__cxx11::string::append(local_558);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
          goto LAB_003657ae;
        }
        CVar9 = curl_easy_setopt(curl,CURLOPT_USERAGENT,"curl/7.38.0");
        if (CVar9 != CURLE_OK) {
          local_558 = (undefined1  [8])local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,"DOWNLOAD cannot set user agent option: ","");
          curl_easy_strerror(CVar9);
          std::__cxx11::string::append(local_558);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
          goto LAB_003657ae;
        }
        CVar9 = curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_832478::cmWriteToFileCallback);
        if (CVar9 != CURLE_OK) {
          local_558 = (undefined1  [8])local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,"DOWNLOAD cannot set write function: ","");
          curl_easy_strerror(CVar9);
          std::__cxx11::string::append(local_558);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
          goto LAB_003657ae;
        }
        CVar9 = curl_easy_setopt(curl,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_832478::cmFileCommandCurlDebugCallback);
        if (CVar9 != CURLE_OK) {
          local_558 = (undefined1  [8])local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,"DOWNLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar9);
          std::__cxx11::string::append(local_558);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
          goto LAB_003657ae;
        }
        if (local_569 == false) {
          CVar9 = curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar9 == CURLE_OK) goto LAB_003659fb;
          local_558 = (undefined1  [8])local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,"Unable to set TLS/SSL Verify off: ","");
          curl_easy_strerror(CVar9);
          std::__cxx11::string::append(local_558);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
          goto LAB_003657ae;
        }
        CVar9 = curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar9 != CURLE_OK) {
          local_558 = (undefined1  [8])local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,"Unable to set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar9);
          std::__cxx11::string::append(local_558);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
          goto LAB_003657ae;
        }
LAB_003659fb:
        cmCurlSetCAInfo_abi_cxx11_(&local_70,curl,local_308);
        if (local_70._M_string_length == 0) {
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (char *)0x0;
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          CVar9 = curl_easy_setopt(curl,CURLOPT_WRITEDATA,local_2a0);
          if (CVar9 == CURLE_OK) {
            CVar9 = curl_easy_setopt(curl,CURLOPT_DEBUGDATA,&local_328);
            if (CVar9 != CURLE_OK) {
              local_558 = (undefined1  [8])local_548;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_558,"DOWNLOAD cannot set debug data: ","");
              curl_easy_strerror(CVar9);
              std::__cxx11::string::append(local_558);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
              goto LAB_00365b75;
            }
            CVar9 = curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1);
            if (CVar9 != CURLE_OK) {
              local_558 = (undefined1  [8])local_548;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_558,"DOWNLOAD cannot set follow-redirect option: ","");
              curl_easy_strerror(CVar9);
              std::__cxx11::string::append(local_558);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
              goto LAB_00365b75;
            }
            if ((local_2c0._M_string_length != 0) &&
               (CVar9 = curl_easy_setopt(curl,CURLOPT_VERBOSE,1), CVar9 != CURLE_OK)) {
              local_558 = (undefined1  [8])local_548;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_558,"DOWNLOAD cannot set verbose: ","");
              curl_easy_strerror(CVar9);
              std::__cxx11::string::append(local_558);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
              goto LAB_00365b75;
            }
            if ((0 < local_560) &&
               (CVar9 = curl_easy_setopt(curl,CURLOPT_TIMEOUT,local_560), CVar9 != CURLE_OK)) {
              local_558 = (undefined1  [8])local_548;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_558,"DOWNLOAD cannot set timeout: ","");
              curl_easy_strerror(CVar9);
              std::__cxx11::string::append(local_558);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
              goto LAB_00365b75;
            }
            if (0 < lVar11) {
              curl_easy_setopt(curl,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(curl,CURLOPT_LOW_SPEED_TIME,lVar11);
            }
            anon_unknown.dwarf_832478::cURLProgressHelper::cURLProgressHelper
                      ((cURLProgressHelper *)local_378,this,"download");
            if ((uVar17 & 1) == 0) {
LAB_00365e37:
              CVar9 = curl_easy_perform(curl);
              local_3e0.Easy = (CURL *)0x0;
              curl_easy_cleanup(curl);
              if (local_2e0._M_string_length != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_558);
                poVar12 = (ostream *)std::ostream::operator<<(local_558,CVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\"",2);
                pcVar14 = curl_easy_strerror(CVar9);
                poVar12 = std::operator<<(poVar12,pcVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
                pcVar4 = (this->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::AddDefinition(pcVar4,&local_2e0,local_3d8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p,
                                  local_3d8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_558);
                std::ios_base::~ios_base(local_4e8);
              }
              curl_global_cleanup();
              std::ostream::flush();
              std::ofstream::close();
              if (local_568 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                cmCryptoHash::HashFile
                          (&local_3d8,(cmCryptoHash *)&local_568->_M_allocated_capacity,&local_398);
                if ((cmFileCommand *)local_3d8._M_string_length == (cmFileCommand *)0x0) {
                  local_558 = (undefined1  [8])local_548;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_558,"DOWNLOAD cannot compute hash on downloaded file",
                             "");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
                  if (local_558 != (undefined1  [8])local_548) {
                    operator_delete((void *)local_558,
                                    CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                             local_548[0]._M_local_buf[0]) + 1);
                  }
LAB_003661db:
                  bVar7 = false;
                  bVar6 = false;
                }
                else if ((local_3b0 != (cmFileCommand *)local_3d8._M_string_length) ||
                        ((bVar7 = true, local_3b0 != (cmFileCommand *)0x0 &&
                         (iVar8 = bcmp(local_3b8,local_3d8._M_dataplus._M_p,(size_t)local_3b0),
                         iVar8 != 0)))) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_558);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_558,"DOWNLOAD HASH mismatch",0x16);
                  poVar12 = std::endl<char,std::char_traits<char>>((ostream *)local_558);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  for file: [",0xd);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_398._M_dataplus._M_p,local_398._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
                  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"    expected hash: [",0x14);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_3b8,(long)local_3b0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
                  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"      actual hash: [",0x14);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_3d8._M_dataplus._M_p,local_3d8._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
                  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"           status: [",0x14);
                  poVar12 = (ostream *)std::ostream::operator<<(poVar12,CVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\"",2);
                  pcVar14 = curl_easy_strerror(CVar9);
                  poVar12 = std::operator<<(poVar12,pcVar14);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"]",2);
                  std::endl<char,std::char_traits<char>>(poVar12);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_50);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_50._M_dataplus._M_p != &local_50.field_2) {
                    operator_delete(local_50._M_dataplus._M_p,
                                    local_50.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_558);
                  std::ios_base::~ios_base(local_4e8);
                  goto LAB_003661db;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p,
                                  local_3d8.field_2._M_allocated_capacity + 1);
                }
                if (!bVar7) goto LAB_00366246;
              }
              bVar6 = true;
              if (local_2c0._M_string_length != 0) {
                local_558 = (undefined1  [8])((ulong)local_558 & 0xffffffffffffff00);
                std::vector<char,_std::allocator<char>_>::push_back(&local_328,local_558);
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,&local_2c0,
                           local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
              }
            }
            else {
              CVar9 = curl_easy_setopt(curl,CURLOPT_NOPROGRESS,0);
              if (CVar9 == CURLE_OK) {
                CVar9 = curl_easy_setopt(curl,CURLOPT_PROGRESSFUNCTION,
                                         anon_unknown.dwarf_832478::cmFileDownloadProgressCallback);
                if (CVar9 == CURLE_OK) {
                  CVar9 = curl_easy_setopt(curl,CURLOPT_PROGRESSDATA,local_378);
                  if (CVar9 == CURLE_OK) goto LAB_00365e37;
                  local_558 = (undefined1  [8])local_548;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_558,"DOWNLOAD cannot set progress data: ","");
                  curl_easy_strerror(CVar9);
                  std::__cxx11::string::append(local_558);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
                }
                else {
                  local_558 = (undefined1  [8])local_548;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_558,"DOWNLOAD cannot set progress function: ","");
                  curl_easy_strerror(CVar9);
                  std::__cxx11::string::append(local_558);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
                }
              }
              else {
                local_558 = (undefined1  [8])local_548;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_558,"DOWNLOAD cannot set noprogress value: ","");
                curl_easy_strerror(CVar9);
                std::__cxx11::string::append(local_558);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
              }
              if (local_558 != (undefined1  [8])local_548) {
                operator_delete((void *)local_558,
                                CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                         local_548[0]._M_local_buf[0]) + 1);
              }
              bVar6 = false;
            }
LAB_00366246:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._16_8_ != &local_358) {
              operator_delete((void *)local_378._16_8_,local_358._M_allocated_capacity + 1);
            }
          }
          else {
            local_558 = (undefined1  [8])local_548;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_558,"DOWNLOAD cannot set write data: ","");
            curl_easy_strerror(CVar9);
            std::__cxx11::string::append(local_558);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
LAB_00365b75:
            if (local_558 != (undefined1  [8])local_548) {
              operator_delete((void *)local_558,
                              CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                       local_548[0]._M_local_buf[0]) + 1);
            }
            bVar6 = false;
          }
          if (local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,&local_70);
          bVar6 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_558 = (undefined1  [8])local_548;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_558,"DOWNLOAD cannot set url: ","");
        curl_easy_strerror(CVar9);
        std::__cxx11::string::append(local_558);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
LAB_003657ae:
        if (local_558 != (undefined1  [8])local_548) {
          operator_delete((void *)local_558,
                          CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                   local_548[0]._M_local_buf[0]) + 1);
        }
        bVar6 = false;
      }
      anon_unknown.dwarf_832478::cURLEasyGuard::~cURLEasyGuard(&local_3e0);
    }
    else {
      local_558 = (undefined1  [8])local_548;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,"DOWNLOAD cannot open file for write.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
LAB_00365277:
      if (local_558 != (undefined1  [8])local_548) {
        operator_delete((void *)local_558,
                        CONCAT71(local_548[0]._M_allocated_capacity._1_7_,
                                 local_548[0]._M_local_buf[0]) + 1);
      }
      bVar6 = false;
    }
    local_2a0 = (undefined1  [8])_VTT;
    *(undefined8 *)
     (local_2a0 + (long)((cmCryptoHash *)(&_VTT->_M_allocated_capacity + -3))->_vptr_cmCryptoHash) =
         __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&local_298);
    std::ios_base::~ios_base(local_1a8);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                   "DOWNLOAD error: cannot create directory \'",&local_348);
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_558);
    local_2a0 = (undefined1  [8])&local_290;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 == paVar15) {
      local_290._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_290._8_8_ = puVar13[3];
    }
    else {
      local_290._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2a0 = (undefined1  [8])*puVar13;
    }
    local_298 = puVar13[1];
    *puVar13 = paVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    if (local_558 != (undefined1  [8])local_548) {
      operator_delete((void *)local_558,
                      CONCAT71(local_548[0]._M_allocated_capacity._1_7_,local_548[0]._M_local_buf[0]
                              ) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
    if (local_2a0 != (undefined1  [8])&local_290) {
      operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
    }
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
LAB_0036582d:
  if (local_568 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (*((_func_int **)local_568->_M_allocated_capacity)[1])();
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                             local_2e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  return bVar6;
}

Assistant:

bool
cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if(args.size() < 3)
    {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
    }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  cmsys::auto_ptr<cmCryptoHash> hash;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "TLS_VERIFY")
      {
      ++i;
      if(i != args.end())
        {
        tls_verify = cmSystemTools::IsOn(i->c_str());
        }
      else
        {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
        }
      }
    else if(*i == "TLS_CAINFO")
      {
      ++i;
      if(i != args.end())
        {
        cainfo = i->c_str();
        }
      else
        {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
        }
      }
    else if(*i == "EXPECTED_MD5")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
        }
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New("MD5"));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }
    else if(*i == "EXPECTED_HASH")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
        }
      std::string::size_type pos = i->find("=");
      if(pos == std::string::npos)
        {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
        }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos+1));
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if(!hash.get())
        {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
        }
      hashMatchMSG = algo + " hash";
      }
    ++i;
    }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if(cmSystemTools::FileExists(file.c_str()) && hash.get())
    {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if(actualHash == expectedHash)
      {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if(!statusVar.empty())
        {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar,
                                      result.str().c_str());
        }
      return true;
      }
    }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if(!cmSystemTools::FileExists(dir.c_str()) &&
     !cmSystemTools::MakeDirectory(dir.c_str()))
    {
    std::string errstring = "DOWNLOAD error: cannot create directory '"
      + dir + "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
    }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if(!fout)
    {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
    }

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
    }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if(tls_verify)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
    }
  else
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
    }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty())
    {
    this->SetError(cainfo_err);
    return false;
    }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
    }

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get())
    {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty())
      {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
      }

    if (expectedHash != actualHash)
      {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
        << "  for file: [" << file << "]" << std::endl
        << "    expected hash: [" << expectedHash << "]" << std::endl
        << "      actual hash: [" << actualHash << "]" << std::endl
        << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl
        ;
      this->SetError(oss.str());
      return false;
      }
    }

  if (!logVar.empty())
    {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
    }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}